

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

wchar_t spell_book_count_spells(player *p,object *obj,_func__Bool_player_ptr_wchar_t *tester)

{
  class_book *pcVar1;
  _Bool _Var2;
  long lVar3;
  wchar_t wVar4;
  long lVar5;
  long lVar6;
  
  lVar3 = (long)(p->class->magic).num_books;
  if (0 < lVar3) {
    pcVar1 = (p->class->magic).books;
    lVar5 = 0;
    do {
      if ((*(uint *)((long)&pcVar1->tval + lVar5) == (uint)obj->tval) &&
         (*(uint *)((long)&pcVar1->sval + lVar5) == (uint)obj->sval)) {
        if (*(int *)((long)&pcVar1->num_spells + lVar5) < 1) {
          return L'\0';
        }
        lVar6 = 0;
        lVar3 = 0x20;
        wVar4 = L'\0';
        do {
          _Var2 = (*tester)(p,*(wchar_t *)(*(long *)((long)&pcVar1->spells + lVar5) + lVar3));
          wVar4 = wVar4 + (uint)_Var2;
          lVar6 = lVar6 + 1;
          lVar3 = lVar3 + 0x38;
        } while (lVar6 < *(int *)((long)&pcVar1->num_spells + lVar5));
        return wVar4;
      }
      lVar5 = lVar5 + 0x20;
    } while (lVar3 * 0x20 != lVar5);
  }
  return L'\0';
}

Assistant:

int spell_book_count_spells(const struct player *p, const struct object *obj,
		bool (*tester)(const struct player *p, int spell))
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	for (i = 0; i < book->num_spells; i++)
		if (tester(p, book->spells[i].sidx))
			n_spells++;

	return n_spells;
}